

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O0

void __thiscall
Lib::Stack<std::pair<Kernel::TermList,_Kernel::RationalConstantType>_>::Stack
          (Stack<std::pair<Kernel::TermList,_Kernel::RationalConstantType>_> *this,
          Stack<std::pair<Kernel::TermList,_Kernel::RationalConstantType>_> *s)

{
  Stack<std::pair<Kernel::TermList,_Kernel::RationalConstantType>_> *in_RSI;
  size_t *in_RDI;
  Stack<std::pair<Kernel::TermList,_Kernel::RationalConstantType>_> *in_stack_00000010;
  BottomFirstIterator in_stack_00000018;
  void *mem;
  BottomFirstIterator local_28;
  void *local_18;
  Stack<std::pair<Kernel::TermList,_Kernel::RationalConstantType>_> *local_10;
  
  *in_RDI = in_RSI->_capacity;
  local_10 = in_RSI;
  if (*in_RDI == 0) {
    in_RDI[1] = 0;
  }
  else {
    local_18 = Lib::alloc((size_t)in_RDI);
    in_RDI[1] = (size_t)local_18;
  }
  in_RDI[2] = in_RDI[1];
  in_RDI[3] = in_RDI[1] + *in_RDI * 0x28;
  BottomFirstIterator::BottomFirstIterator(&local_28,local_10);
  Stack<std::pair<Kernel::TermList,Kernel::RationalConstantType>>::
  loadFromIterator<Lib::Stack<std::pair<Kernel::TermList,Kernel::RationalConstantType>>::BottomFirstIterator>
            (in_stack_00000010,in_stack_00000018);
  return;
}

Assistant:

Stack(const Stack& s)
   : _capacity(s._capacity)
  {
    if(_capacity) {
      void* mem = ALLOC_KNOWN(_capacity*sizeof(C),className());
      _stack = static_cast<C*>(mem);
    }
    else {
      _stack = 0;
    }
    _cursor = _stack;
    _end = _stack+_capacity;

    loadFromIterator(BottomFirstIterator(const_cast<Stack&>(s)));
  }